

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O0

void __thiscall Executor::visit(Executor *this,StringLiteralNode *node)

{
  StringLiteralNode *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  unique_ptr<String,_std::default_delete<String>_> *in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  
  __args = in_RDI;
  StringLiteralNode::getValue_abi_cxx11_(in_RSI);
  std::make_unique<String,std::__cxx11::string_const&>(__args);
  std::unique_ptr<Value,std::default_delete<Value>>::operator=
            ((unique_ptr<Value,_std::default_delete<Value>_> *)in_RSI,in_stack_ffffffffffffffe8);
  std::unique_ptr<String,_std::default_delete<String>_>::~unique_ptr
            ((unique_ptr<String,_std::default_delete<String>_> *)in_RDI);
  return;
}

Assistant:

void Executor::visit(const StringLiteralNode& node)
{
  value_ = std::make_unique<String>(node.getValue());
}